

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void cereal::
     load<cereal::BinaryInputArchive,std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>
               (BinaryInputArchive *ar,
               optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
               *optional)

{
  bool nullopt;
  bool local_19;
  
  InputArchive<cereal::BinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::BinaryInputArchive,1u> *)ar,&local_19);
  if (local_19 == true) {
    std::
    _Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
    ::_M_reset((_Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
                *)optional);
  }
  else {
    std::
    optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
    ::emplace<>(optional);
    InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)ar,
               (variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
                *)optional);
  }
  return;
}

Assistant:

inline
  void CEREAL_LOAD_FUNCTION_NAME(Archive& ar, std::optional<T>& optional)
  {
    bool nullopt;
    ar(CEREAL_NVP_("nullopt", nullopt));

    if (nullopt) {
      optional = std::nullopt;
    } else {
      optional.emplace();
      ar(CEREAL_NVP_("data", *optional));
    }
  }